

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

string * __thiscall
bloaty::(anonymous_namespace)::SiPrint_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int64_t size,bool force_sign)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  ulong uVar8;
  uint __len;
  ulong uVar9;
  bool bVar10;
  double d;
  double dVar11;
  string ret;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _anonymous_namespace_ *local_40;
  string *local_38;
  
  cVar2 = (char)size;
  d = (double)(long)this;
  dVar11 = ABS(d);
  if (dVar11 <= 1024.0) {
    uVar9 = 0;
  }
  else {
    uVar8 = 0;
    do {
      d = d * 0.0009765625;
      uVar9 = uVar8 + 1;
      dVar11 = ABS(d);
      if (dVar11 <= 1024.0) break;
      bVar10 = uVar8 < 2;
      uVar8 = uVar9;
    } while (bVar10);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  if (uVar9 != 0 && dVar11 <= 100.0) {
    if (dVar11 <= 10.0) {
      if (cVar2 == '\0') {
        DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%0.2f",(char *)size,d);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
      }
      else {
        DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%+0.2f",(char *)size,d);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
      }
    }
    else if (cVar2 == '\0') {
      DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%0.1f",(char *)size,d);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
    }
    else {
      DoubleStringPrintf_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)"%+0.1f",(char *)size,d);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
    }
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80.field_2._8_8_ = plVar4[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_80._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    _Var7._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00182434;
  }
  else {
    uVar8 = (ulong)d;
    uVar9 = -uVar8;
    if (0 < (long)uVar8) {
      uVar9 = uVar8;
    }
    __len = 1;
    if (9 < uVar9) {
      uVar5 = uVar9;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00182308;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00182308;
        }
        if (uVar5 < 10000) goto LAB_00182308;
        bVar10 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar3 = __len + 4;
      } while (bVar10);
      __len = __len + 1;
    }
LAB_00182308:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_40 = this;
    local_38 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)__len - (char)((long)uVar8 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_a0._M_dataplus._M_p + -((long)uVar8 >> 0x3f),__len,uVar9);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
    __return_storage_ptr__ = local_38;
    paVar1 = &local_80.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80.field_2._8_8_ = plVar4[3];
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar6;
      local_80._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_80._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (cVar2 != '\x01' || (long)local_40 < 1) goto LAB_00182434;
    std::operator+(&local_80,"+",&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    local_a0.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    _Var7._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar1) goto LAB_00182434;
  }
  operator_delete(_Var7._M_p,local_a0.field_2._M_allocated_capacity + 1);
LAB_00182434:
  anon_unknown_35::LeftPad(__return_storage_ptr__,&local_60,7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SiPrint(int64_t size, bool force_sign) {
  const char* prefixes[] = {"", "Ki", "Mi", "Gi", "Ti"};
  size_t num_prefixes = 5;
  size_t n = 0;
  double size_d = size;
  while (fabs(size_d) > 1024 && n < num_prefixes - 2) {
    size_d /= 1024;
    n++;
  }

  std::string ret;

  if (fabs(size_d) > 100 || n == 0) {
    ret = std::to_string(static_cast<int64_t>(size_d)) + prefixes[n];
    if (force_sign && size > 0) {
      ret = "+" + ret;
    }
  } else if (fabs(size_d) > 10) {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.1f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.1f", size_d) + prefixes[n];
    }
  } else {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.2f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.2f", size_d) + prefixes[n];
    }
  }

  return LeftPad(ret, 7);
}